

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O2

QuartetSet * GenerateQuartetTargets(QuartetSet *__return_storage_ptr__,QAM *am)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  Gaussian cur4;
  Gaussian cur3;
  Gaussian cur2;
  Gaussian cur1;
  Doublet bra;
  Doublet ket;
  undefined1 local_d8 [168];
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  cur1.ijk._M_elems[0] = (am->qam)._M_elems[0];
  iVar3 = (am->qam)._M_elems[1];
  iVar6 = ((cur1.ijk._M_elems[0] + 2) * (cur1.ijk._M_elems[0] + 1)) / 2;
  iVar7 = ((iVar3 + 2) * (iVar3 + 1)) / 2;
  iVar3 = (am->qam)._M_elems[2];
  iVar8 = ((iVar3 + 2) * (iVar3 + 1)) / 2;
  iVar3 = (am->qam)._M_elems[3];
  iVar3 = ((iVar3 + 2) * (iVar3 + 1)) / 2;
  cur1.ijk._M_elems[1] = 0;
  cur1.ijk._M_elems[2] = 0;
  psVar2 = &am->tag;
  iVar10 = 0;
  if (iVar3 < 1) {
    iVar3 = iVar10;
  }
  if (iVar8 < 1) {
    iVar8 = iVar10;
  }
  if (iVar7 < 1) {
    iVar7 = iVar10;
  }
  if (iVar6 < 1) {
    iVar6 = iVar10;
  }
  for (; iVar10 != iVar6; iVar10 = iVar10 + 1) {
    cur2.ijk._M_elems[0] = (am->qam)._M_elems[1];
    cur2.ijk._M_elems[1] = 0;
    cur2.ijk._M_elems[2] = 0;
    for (iVar4 = 0; iVar4 != iVar7; iVar4 = iVar4 + 1) {
      bra.type = BRA;
      bra.left.ijk._M_elems[2] = cur1.ijk._M_elems[2];
      bra.left.ijk._M_elems[1] = cur1.ijk._M_elems[1];
      bra.left.ijk._M_elems[0] = cur1.ijk._M_elems[0];
      bra.right.ijk._M_elems[2] = cur2.ijk._M_elems[2];
      bra.right.ijk._M_elems[1] = cur2.ijk._M_elems[1];
      bra.right.ijk._M_elems[0] = cur2.ijk._M_elems[0];
      std::__cxx11::string::string((string *)&bra.tag,(string *)psVar2);
      cur3.ijk._M_elems[0] = (am->qam)._M_elems[2];
      cur3.ijk._M_elems[1] = 0;
      cur3.ijk._M_elems[2] = 0;
      for (iVar5 = 0; iVar5 != iVar8; iVar5 = iVar5 + 1) {
        cur4.ijk._M_elems[0] = (am->qam)._M_elems[3];
        cur4.ijk._M_elems[1] = 0;
        cur4.ijk._M_elems[2] = 0;
        iVar9 = iVar3;
        while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
          ket.type = KET;
          ket.left.ijk._M_elems[2] = cur3.ijk._M_elems[2];
          ket.left.ijk._M_elems[1] = cur3.ijk._M_elems[1];
          ket.left.ijk._M_elems[0] = cur3.ijk._M_elems[0];
          ket.right.ijk._M_elems[2] = cur4.ijk._M_elems[2];
          ket.right.ijk._M_elems[1] = cur4.ijk._M_elems[1];
          ket.right.ijk._M_elems[0] = cur4.ijk._M_elems[0];
          std::__cxx11::string::string((string *)&ket.tag,(string *)psVar2);
          Doublet::Doublet((Doublet *)local_d8,&bra);
          Doublet::Doublet((Doublet *)(local_d8 + 0x40),&ket);
          local_d8._128_4_ = 0;
          std::__cxx11::string::string((string *)(local_d8 + 0x88),(string *)psVar2);
          std::
          _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
          ::_M_insert_unique<Quartet>(&__return_storage_ptr__->_M_t,(Quartet *)local_d8);
          Quartet::~Quartet((Quartet *)local_d8);
          Gaussian::Iterate(&cur4);
          std::__cxx11::string::~string((string *)&ket.tag);
        }
        Gaussian::Iterate(&cur3);
      }
      Gaussian::Iterate(&cur2);
      std::__cxx11::string::~string((string *)&bra.tag);
    }
    Gaussian::Iterate(&cur1);
  }
  return __return_storage_ptr__;
}

Assistant:

QuartetSet GenerateQuartetTargets(QAM am)
{
    QuartetSet qs;
    int nam1 = ((am[0] + 1) * (am[0] + 2)) / 2;
    int nam2 = ((am[1] + 1) * (am[1] + 2)) / 2;
    int nam3 = ((am[2] + 1) * (am[2] + 2)) / 2;
    int nam4 = ((am[3] + 1) * (am[3] + 2)) / 2;

    Gaussian cur1 = Gaussian{am[0], 0, 0};
    for(int i = 0; i < nam1; i++)
    {
        Gaussian cur2 = Gaussian{am[1], 0, 0};
        for(int j = 0; j < nam2; j++)
        {
            Doublet bra{DoubletType::BRA, cur1, cur2, am.tag};
            Gaussian cur3 = Gaussian{am[2], 0, 0};
            for(int k = 0; k < nam3; k++)
            {
                Gaussian cur4 = Gaussian{am[3], 0, 0};
                for(int l = 0; l < nam4; l++)
                {
                    Doublet ket{DoubletType::KET, cur3, cur4, am.tag};
                    qs.insert(Quartet{bra, ket, 0, am.tag});
                    cur4.Iterate();
                } 

                cur3.Iterate();
            }

            cur2.Iterate(); 
        }       
                
        cur1.Iterate();
    }
                
    return qs;
}